

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O1

int set(state_t *state,int linenum,seqmap_entry_t *ent)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  char *__format;
  byte *str;
  char **kwp;
  undefined **ppuVar5;
  bool bVar6;
  stringref_t ref;
  
  if (state->ident != 0) {
    str = (byte *)ent->value;
    bVar1 = *str;
    if ((bVar1 == 0) || ((byte)(bVar1 - 0x30) < 10)) {
LAB_00116a5c:
      pcVar4 = state->fn;
      __format = "%s:%s:%u: \'%s\' isn\'t valid identifier\n";
    }
    else {
      bVar6 = false;
      pbVar3 = str;
      do {
        pbVar3 = pbVar3 + 1;
        if ((0x19 < (byte)(bVar1 + 0x9f) && 9 < (byte)(bVar1 - 0x30)) &&
           (bVar1 != 0x5f && 0x19 < (byte)(bVar1 + 0xbf))) {
          if (!bVar6) goto LAB_00116a5c;
          break;
        }
        bVar1 = *pbVar3;
        bVar6 = bVar1 == 0;
      } while (!bVar6);
      ref.len = 4;
      ref.str = "ins_";
      iVar2 = util_strcmp_ref((char *)str,ref);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%s:%u: mnemonic can\'t start with \'ins_\'\n",argv0,state->fn,linenum);
        return 1;
      }
      ppuVar5 = &is_keyword_keywords;
      do {
        pcVar4 = *ppuVar5;
        if (pcVar4 == (char *)0x0) goto LAB_00116a44;
        ppuVar5 = ppuVar5 + 1;
        iVar2 = strcmp((char *)str,pcVar4);
      } while (iVar2 != 0);
      pcVar4 = state->fn;
      __format = "%s:%s:%u: \'%s\' is a keyword, ignoring\n";
    }
LAB_00116a81:
    fprintf(_stderr,__format,argv0,pcVar4,linenum,str);
    return 1;
  }
  if (state->smap == state->emap->gvar_types) {
    str = (byte *)ent->value;
    if (((*str & 0xfe) != 0x24) || ((*str != 0 && (str[1] != 0)))) {
      pcVar4 = state->fn;
      __format = "%s:%s:%u: unknown type \'%s\'\n";
      goto LAB_00116a81;
    }
  }
  else if (validate_signature_warned == '\0') {
    set_cold_1();
  }
LAB_00116a44:
  seqmap_set(state->smap,ent);
  return 0;
}

Assistant:

static int
set(
    state_t *state,
    int linenum,
    const seqmap_entry_t* ent)
{
    if (state->ident) {
        if (validate_ident(state, linenum, ent->value))
            return 1;
    } else if (state->smap == state->emap->gvar_types) {
        if (validate_type(state, linenum, ent->value))
            return 1;
    } else {
        if (validate_signature(state, linenum, ent->value))
            return 1;
    }
    seqmap_set(state->smap, ent);
    return 0;
}